

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O2

void __thiscall leveldb::VersionEdit::EncodeTo(VersionEdit *this,string *dst)

{
  pointer ppVar1;
  _Base_ptr p_Var2;
  long lVar3;
  size_t i;
  ulong uVar4;
  size_t i_1;
  long in_FS_OFFSET;
  Slice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->has_comparator_ == true) {
    PutVarint32(dst,1);
    local_48.data_ = (this->comparator_)._M_dataplus._M_p;
    local_48.size_ = (this->comparator_)._M_string_length;
    PutLengthPrefixedSlice(dst,&local_48);
  }
  if (this->has_log_number_ == true) {
    PutVarint32(dst,2);
    PutVarint64(dst,this->log_number_);
  }
  if (this->has_prev_log_number_ == true) {
    PutVarint32(dst,9);
    PutVarint64(dst,this->prev_log_number_);
  }
  if (this->has_next_file_number_ == true) {
    PutVarint32(dst,3);
    PutVarint64(dst,this->next_file_number_);
  }
  if (this->has_last_sequence_ == true) {
    PutVarint32(dst,4);
    PutVarint64(dst,this->last_sequence_);
  }
  lVar3 = 8;
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)(this->compact_pointers_).
                             super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->compact_pointers_).
                            super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x28); uVar4 = uVar4 + 1) {
    PutVarint32(dst,5);
    PutVarint32(dst,*(uint32_t *)
                     ((long)(this->compact_pointers_).
                            super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar3 + -8));
    local_48 = InternalKey::Encode((InternalKey *)
                                   ((long)&((this->compact_pointers_).
                                            super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->first +
                                   lVar3));
    PutLengthPrefixedSlice(dst,&local_48);
    lVar3 = lVar3 + 0x28;
  }
  for (p_Var2 = (this->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->deleted_files_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    PutVarint32(dst,6);
    PutVarint32(dst,p_Var2[1]._M_color);
    PutVarint64(dst,(uint64_t)p_Var2[1]._M_parent);
  }
  lVar3 = 0x20;
  uVar4 = 0;
  while( true ) {
    ppVar1 = (this->new_files_).
             super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->new_files_).
                       super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) / 0x60) <= uVar4)
    break;
    PutVarint32(dst,7);
    PutVarint32(dst,*(uint32_t *)
                     ((long)(this->new_files_).
                            super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x20));
    PutVarint64(dst,*(uint64_t *)((long)ppVar1 + lVar3 + -0x10));
    PutVarint64(dst,*(uint64_t *)((long)ppVar1 + lVar3 + -8));
    local_48 = InternalKey::Encode((InternalKey *)((long)&ppVar1->first + lVar3));
    PutLengthPrefixedSlice(dst,&local_48);
    local_48 = InternalKey::Encode((InternalKey *)((long)&(ppVar1->second).smallest.rep_ + lVar3));
    PutLengthPrefixedSlice(dst,&local_48);
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x60;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VersionEdit::EncodeTo(std::string* dst) const {
  if (has_comparator_) {
    PutVarint32(dst, kComparator);
    PutLengthPrefixedSlice(dst, comparator_);
  }
  if (has_log_number_) {
    PutVarint32(dst, kLogNumber);
    PutVarint64(dst, log_number_);
  }
  if (has_prev_log_number_) {
    PutVarint32(dst, kPrevLogNumber);
    PutVarint64(dst, prev_log_number_);
  }
  if (has_next_file_number_) {
    PutVarint32(dst, kNextFileNumber);
    PutVarint64(dst, next_file_number_);
  }
  if (has_last_sequence_) {
    PutVarint32(dst, kLastSequence);
    PutVarint64(dst, last_sequence_);
  }

  for (size_t i = 0; i < compact_pointers_.size(); i++) {
    PutVarint32(dst, kCompactPointer);
    PutVarint32(dst, compact_pointers_[i].first);  // level
    PutLengthPrefixedSlice(dst, compact_pointers_[i].second.Encode());
  }

  for (const auto& deleted_file_kvp : deleted_files_) {
    PutVarint32(dst, kDeletedFile);
    PutVarint32(dst, deleted_file_kvp.first);   // level
    PutVarint64(dst, deleted_file_kvp.second);  // file number
  }

  for (size_t i = 0; i < new_files_.size(); i++) {
    const FileMetaData& f = new_files_[i].second;
    PutVarint32(dst, kNewFile);
    PutVarint32(dst, new_files_[i].first);  // level
    PutVarint64(dst, f.number);
    PutVarint64(dst, f.file_size);
    PutLengthPrefixedSlice(dst, f.smallest.Encode());
    PutLengthPrefixedSlice(dst, f.largest.Encode());
  }
}